

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCIntersectArguments *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar17;
  byte bVar18;
  uint uVar19;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar20) [32];
  long lVar21;
  float *vertices_2;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  size_t sVar38;
  bool bVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  float fVar82;
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  long lStack_2670;
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<8>_> *local_2640;
  int local_261c;
  undefined1 local_2618 [16];
  undefined1 local_2608 [16];
  long local_25f8;
  long local_25f0;
  long local_25e8;
  Scene *local_25e0;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  UVIdentity<4> *local_2538;
  byte local_2530;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  float local_24d8 [4];
  undefined1 local_24c8 [32];
  undefined1 local_24a8 [32];
  undefined1 local_2488 [32];
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 auVar71 [32];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_2640 = stack + 1;
    stack[0].dist = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar41 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar111 = ZEXT1664(auVar41);
    auVar42 = vmaxss_avx512f(auVar41,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar92 = (ray->super_RayK<1>).tfar;
    auVar81 = ZEXT464((uint)fVar92);
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar43 = vandps_avx512vl((undefined1  [16])aVar3,auVar43);
    auVar44._8_4_ = 0x219392ef;
    auVar44._0_8_ = 0x219392ef219392ef;
    auVar44._12_4_ = 0x219392ef;
    uVar40 = vcmpps_avx512vl(auVar43,auVar44,1);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar112 = ZEXT1664(auVar43);
    auVar43 = vdivps_avx512vl(auVar43,(undefined1  [16])aVar3);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar39 = (bool)((byte)uVar40 & 1);
    auVar48._0_4_ = (uint)bVar39 * auVar44._0_4_ | (uint)!bVar39 * auVar43._0_4_;
    bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
    auVar48._4_4_ = (uint)bVar39 * auVar44._4_4_ | (uint)!bVar39 * auVar43._4_4_;
    bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
    auVar48._8_4_ = (uint)bVar39 * auVar44._8_4_ | (uint)!bVar39 * auVar43._8_4_;
    bVar39 = (bool)((byte)(uVar40 >> 3) & 1);
    auVar48._12_4_ = (uint)bVar39 * auVar44._12_4_ | (uint)!bVar39 * auVar43._12_4_;
    auVar45._8_4_ = 0x3f7ffffa;
    auVar45._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar45._12_4_ = 0x3f7ffffa;
    vmulps_avx512vl(auVar48,auVar45);
    auVar46._8_4_ = 0x3f800003;
    auVar46._0_8_ = 0x3f8000033f800003;
    auVar46._12_4_ = 0x3f800003;
    auVar45 = vmulps_avx512vl(auVar48,auVar46);
    local_2488 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar113 = ZEXT3264(local_2488);
    auVar46 = vmaxss_avx512f(auVar41,ZEXT416((uint)fVar92));
    local_24a8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar114 = ZEXT3264(local_24a8);
    local_24c8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar115 = ZEXT3264(local_24c8);
    auVar44 = vucomiss_avx512f(auVar41);
    fVar82 = auVar44._0_4_;
    auVar43 = vmovshdup_avx(auVar44);
    uVar85 = auVar43._0_8_;
    local_23b8._8_8_ = uVar85;
    local_23b8._0_8_ = uVar85;
    local_23b8._16_8_ = uVar85;
    local_23b8._24_8_ = uVar85;
    auVar98 = ZEXT3264(local_23b8);
    vshufpd_avx(auVar44,auVar44,1);
    auVar67._8_4_ = 2;
    auVar67._0_8_ = 0x200000002;
    auVar67._12_4_ = 2;
    auVar67._16_4_ = 2;
    auVar67._20_4_ = 2;
    auVar67._24_4_ = 2;
    auVar67._28_4_ = 2;
    local_23d8 = vpermps_avx2(auVar67,ZEXT1632(auVar44));
    auVar99 = ZEXT3264(local_23d8);
    fVar75 = auVar45._0_4_;
    auVar66._8_4_ = 1;
    auVar66._0_8_ = 0x100000001;
    auVar66._12_4_ = 1;
    auVar66._16_4_ = 1;
    auVar66._20_4_ = 1;
    auVar66._24_4_ = 1;
    auVar66._28_4_ = 1;
    local_2418 = vpermps_avx2(auVar66,ZEXT1632(auVar45));
    auVar106 = ZEXT3264(local_2418);
    local_2438 = vpermps_avx2(auVar67,ZEXT1632(auVar45));
    auVar107 = ZEXT3264(local_2438);
    lVar31 = 0;
    vucomiss_avx512f(auVar41);
    vucomiss_avx512f(auVar41);
    local_2458 = vbroadcastss_avx512vl(auVar42);
    auVar108 = ZEXT3264(local_2458);
    uVar84 = auVar46._0_4_;
    auVar80 = ZEXT3264(CONCAT428(uVar84,CONCAT424(uVar84,CONCAT420(uVar84,CONCAT416(uVar84,CONCAT412
                                                  (uVar84,CONCAT48(uVar84,CONCAT44(uVar84,uVar84))))
                                                  ))));
    auVar66 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar109 = ZEXT3264(auVar66);
    auVar66 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar110 = ZEXT3264(auVar66);
    local_25f8 = 0;
    local_2398 = fVar82;
    fStack_2394 = fVar82;
    fStack_2390 = fVar82;
    fStack_238c = fVar82;
    fStack_2388 = fVar82;
    fStack_2384 = fVar82;
    fStack_2380 = fVar82;
    fStack_237c = fVar82;
    local_23f8 = fVar75;
    fStack_23f4 = fVar75;
    fStack_23f0 = fVar75;
    fStack_23ec = fVar75;
    fStack_23e8 = fVar75;
    fStack_23e4 = fVar75;
    fStack_23e0 = fVar75;
    fStack_23dc = fVar75;
    fVar92 = fVar82;
    fVar93 = fVar82;
    fVar94 = fVar82;
    fVar95 = fVar82;
    fVar96 = fVar82;
    fVar97 = fVar82;
    fVar100 = fVar75;
    fVar101 = fVar75;
    fVar102 = fVar75;
    fVar103 = fVar75;
    fVar104 = fVar75;
    fVar105 = fVar75;
LAB_01c6590c:
    if (local_2640 != stack) {
      pSVar17 = local_2640 + -1;
      local_2640 = local_2640 + -1;
      if ((float)pSVar17->dist <= auVar81._0_4_) {
        sVar38 = (local_2640->ptr).ptr;
        do {
          while( true ) {
            uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar72._4_4_ = uVar84;
            auVar72._0_4_ = uVar84;
            auVar72._8_4_ = uVar84;
            auVar72._12_4_ = uVar84;
            auVar72._16_4_ = uVar84;
            auVar72._20_4_ = uVar84;
            auVar72._24_4_ = uVar84;
            auVar72._28_4_ = uVar84;
            do {
              if ((sVar38 & 8) != 0) {
                local_25f0 = (ulong)((uint)sVar38 & 0xf) - 8;
                uVar40 = sVar38 & 0xfffffffffffffff0;
                local_25e8 = 0;
                goto LAB_01c65d4e;
              }
              pauVar20 = (undefined1 (*) [32])(sVar38 & 0xfffffffffffffff0);
              auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + lVar31),auVar72,
                                        *(undefined1 (*) [32])(pauVar20[2] + lVar31));
              auVar66 = vsubps_avx512vl(ZEXT1632(auVar43),auVar113._0_32_);
              auVar68._4_4_ = fVar92 * auVar66._4_4_;
              auVar68._0_4_ = fVar82 * auVar66._0_4_;
              auVar68._8_4_ = fVar93 * auVar66._8_4_;
              auVar68._12_4_ = fVar94 * auVar66._12_4_;
              auVar68._16_4_ = fVar95 * auVar66._16_4_;
              auVar68._20_4_ = fVar96 * auVar66._20_4_;
              auVar68._24_4_ = fVar97 * auVar66._24_4_;
              auVar68._28_4_ = auVar66._28_4_;
              auVar67 = vmaxps_avx512vl(auVar108._0_32_,auVar68);
              auVar43 = vfmadd213ps_fma(pauVar20[10],auVar72,pauVar20[4]);
              auVar66 = vsubps_avx512vl(ZEXT1632(auVar43),auVar114._0_32_);
              auVar69._4_4_ = auVar98._4_4_ * auVar66._4_4_;
              auVar69._0_4_ = auVar98._0_4_ * auVar66._0_4_;
              auVar69._8_4_ = auVar98._8_4_ * auVar66._8_4_;
              auVar69._12_4_ = auVar98._12_4_ * auVar66._12_4_;
              auVar69._16_4_ = auVar98._16_4_ * auVar66._16_4_;
              auVar69._20_4_ = auVar98._20_4_ * auVar66._20_4_;
              auVar69._24_4_ = auVar98._24_4_ * auVar66._24_4_;
              auVar69._28_4_ = auVar66._28_4_;
              auVar43 = vfmadd213ps_fma(pauVar20[0xc],auVar72,pauVar20[6]);
              auVar66 = vsubps_avx512vl(ZEXT1632(auVar43),auVar115._0_32_);
              auVar70._4_4_ = auVar99._4_4_ * auVar66._4_4_;
              auVar70._0_4_ = auVar99._0_4_ * auVar66._0_4_;
              auVar70._8_4_ = auVar99._8_4_ * auVar66._8_4_;
              auVar70._12_4_ = auVar99._12_4_ * auVar66._12_4_;
              auVar70._16_4_ = auVar99._16_4_ * auVar66._16_4_;
              auVar70._20_4_ = auVar99._20_4_ * auVar66._20_4_;
              auVar70._24_4_ = auVar99._24_4_ * auVar66._24_4_;
              auVar70._28_4_ = auVar66._28_4_;
              auVar66 = vmaxps_avx(auVar69,auVar70);
              auVar66 = vmaxps_avx(auVar67,auVar66);
              auVar43 = vfmadd213ps_fma(pauVar20[9],auVar72,pauVar20[3]);
              auVar67 = vsubps_avx512vl(ZEXT1632(auVar43),auVar113._0_32_);
              auVar12._4_4_ = fVar100 * auVar67._4_4_;
              auVar12._0_4_ = fVar75 * auVar67._0_4_;
              auVar12._8_4_ = fVar101 * auVar67._8_4_;
              auVar12._12_4_ = fVar102 * auVar67._12_4_;
              auVar12._16_4_ = fVar103 * auVar67._16_4_;
              auVar12._20_4_ = fVar104 * auVar67._20_4_;
              auVar12._24_4_ = fVar105 * auVar67._24_4_;
              auVar12._28_4_ = auVar67._28_4_;
              auVar67 = vminps_avx(auVar80._0_32_,auVar12);
              auVar43 = vfmadd213ps_fma(pauVar20[0xb],auVar72,pauVar20[5]);
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar43),auVar114._0_32_);
              auVar74._4_4_ = auVar106._4_4_ * auVar68._4_4_;
              auVar74._0_4_ = auVar106._0_4_ * auVar68._0_4_;
              auVar74._8_4_ = auVar106._8_4_ * auVar68._8_4_;
              auVar74._12_4_ = auVar106._12_4_ * auVar68._12_4_;
              auVar74._16_4_ = auVar106._16_4_ * auVar68._16_4_;
              auVar74._20_4_ = auVar106._20_4_ * auVar68._20_4_;
              auVar74._24_4_ = auVar106._24_4_ * auVar68._24_4_;
              auVar74._28_4_ = auVar68._28_4_;
              auVar43 = vfmadd213ps_fma(pauVar20[0xd],auVar72,pauVar20[7]);
              auVar68 = vsubps_avx512vl(ZEXT1632(auVar43),auVar115._0_32_);
              auVar73._4_4_ = auVar107._4_4_ * auVar68._4_4_;
              auVar73._0_4_ = auVar107._0_4_ * auVar68._0_4_;
              auVar73._8_4_ = auVar107._8_4_ * auVar68._8_4_;
              auVar73._12_4_ = auVar107._12_4_ * auVar68._12_4_;
              auVar73._16_4_ = auVar107._16_4_ * auVar68._16_4_;
              auVar73._20_4_ = auVar107._20_4_ * auVar68._20_4_;
              auVar73._24_4_ = auVar107._24_4_ * auVar68._24_4_;
              auVar73._28_4_ = auVar68._28_4_;
              auVar68 = vminps_avx(auVar74,auVar73);
              auVar67 = vminps_avx(auVar67,auVar68);
              uVar40 = vcmpps_avx512vl(auVar66,auVar67,2);
              if (((uint)sVar38 & 7) == 6) {
                uVar22 = vcmpps_avx512vl(auVar72,pauVar20[0xe],0xd);
                uVar27 = vcmpps_avx512vl(auVar72,pauVar20[0xf],1);
                uVar40 = uVar40 & uVar22 & uVar27;
              }
              bVar18 = (byte)uVar40;
              if (bVar18 == 0) {
                auVar43 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                                 ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0))
                ;
                auVar81 = ZEXT1664(auVar43);
                goto LAB_01c6590c;
              }
              auVar67 = *pauVar20;
              auVar68 = pauVar20[1];
              auVar69 = vmovdqa64_avx512vl(auVar109._0_32_);
              auVar69 = vpternlogd_avx512vl(auVar69,auVar66,auVar110._0_32_,0xf8);
              auVar70 = vpcompressd_avx512vl(auVar69);
              auVar71._0_4_ =
                   (uint)(bVar18 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar69._0_4_;
              bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
              auVar71._4_4_ = (uint)bVar39 * auVar70._4_4_ | (uint)!bVar39 * auVar69._4_4_;
              bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
              auVar71._8_4_ = (uint)bVar39 * auVar70._8_4_ | (uint)!bVar39 * auVar69._8_4_;
              bVar39 = (bool)((byte)(uVar40 >> 3) & 1);
              auVar71._12_4_ = (uint)bVar39 * auVar70._12_4_ | (uint)!bVar39 * auVar69._12_4_;
              bVar39 = (bool)((byte)(uVar40 >> 4) & 1);
              auVar71._16_4_ = (uint)bVar39 * auVar70._16_4_ | (uint)!bVar39 * auVar69._16_4_;
              bVar39 = (bool)((byte)(uVar40 >> 5) & 1);
              auVar71._20_4_ = (uint)bVar39 * auVar70._20_4_ | (uint)!bVar39 * auVar69._20_4_;
              bVar39 = (bool)((byte)(uVar40 >> 6) & 1);
              auVar71._24_4_ = (uint)bVar39 * auVar70._24_4_ | (uint)!bVar39 * auVar69._24_4_;
              bVar39 = SUB81(uVar40 >> 7,0);
              auVar71._28_4_ = (uint)bVar39 * auVar70._28_4_ | (uint)!bVar39 * auVar69._28_4_;
              auVar69 = vpermt2q_avx512vl(auVar67,auVar71,auVar68);
              sVar38 = auVar69._0_8_;
              bVar18 = bVar18 - 1 & bVar18;
            } while (bVar18 == 0);
            auVar72 = vpshufd_avx2(auVar71,0x55);
            vpermt2q_avx512vl(auVar67,auVar72,auVar68);
            auVar69 = vpminsd_avx2(auVar71,auVar72);
            auVar72 = vpmaxsd_avx2(auVar71,auVar72);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 != 0) break;
            auVar69 = vpermi2q_avx512vl(auVar69,auVar67,auVar68);
            sVar38 = auVar69._0_8_;
            auVar67 = vpermt2q_avx512vl(auVar67,auVar72,auVar68);
            (local_2640->ptr).ptr = auVar67._0_8_;
            lVar21 = 8;
            lStack_2670 = 0x10;
LAB_01c65ae3:
            auVar66 = vpermd_avx2(auVar72,auVar66);
            *(int *)((long)&(local_2640->ptr).ptr + lVar21) = auVar66._0_4_;
            local_2640 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_2640->ptr).ptr + lStack_2670);
          }
          auVar12 = vpshufd_avx2(auVar71,0xaa);
          vpermt2q_avx512vl(auVar67,auVar12,auVar68);
          auVar70 = vpminsd_avx2(auVar69,auVar12);
          auVar69 = vpmaxsd_avx2(auVar69,auVar12);
          auVar12 = vpminsd_avx2(auVar72,auVar69);
          auVar69 = vpmaxsd_avx2(auVar72,auVar69);
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 == 0) {
            auVar72 = vpermi2q_avx512vl(auVar70,auVar67,auVar68);
            sVar38 = auVar72._0_8_;
            auVar72 = vpermt2q_avx512vl(auVar67,auVar69,auVar68);
            (local_2640->ptr).ptr = auVar72._0_8_;
            auVar72 = vpermd_avx2(auVar69,auVar66);
            local_2640->dist = auVar72._0_4_;
            auVar67 = vpermt2q_avx512vl(auVar67,auVar12,auVar68);
            local_2640[1].ptr.ptr = auVar67._0_8_;
            lStack_2670 = 0x18;
            lVar21 = lStack_2670;
            lStack_2670 = 0x20;
            auVar72 = auVar12;
            goto LAB_01c65ae3;
          }
          auVar72 = vpshufd_avx2(auVar71,0xff);
          vpermt2q_avx512vl(auVar67,auVar72,auVar68);
          auVar74 = vpminsd_avx2(auVar70,auVar72);
          auVar70 = vpmaxsd_avx2(auVar70,auVar72);
          auVar72 = vpminsd_avx2(auVar12,auVar70);
          auVar70 = vpmaxsd_avx2(auVar12,auVar70);
          auVar12 = vpminsd_avx2(auVar69,auVar70);
          auVar69 = vpmaxsd_avx2(auVar69,auVar70);
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 == 0) {
            auVar70 = vpermi2q_avx512vl(auVar74,auVar67,auVar68);
            sVar38 = auVar70._0_8_;
            auVar70 = vpermt2q_avx512vl(auVar67,auVar69,auVar68);
            (local_2640->ptr).ptr = auVar70._0_8_;
            auVar69 = vpermd_avx2(auVar69,auVar66);
            local_2640->dist = auVar69._0_4_;
            auVar69 = vpermt2q_avx512vl(auVar67,auVar12,auVar68);
            local_2640[1].ptr.ptr = auVar69._0_8_;
            auVar69 = vpermd_avx2(auVar12,auVar66);
            local_2640[1].dist = auVar69._0_4_;
            auVar67 = vpermt2q_avx512vl(auVar67,auVar72,auVar68);
            local_2640[2].ptr.ptr = auVar67._0_8_;
            lVar21 = 0x28;
            lStack_2670 = 0x30;
            goto LAB_01c65ae3;
          }
          auVar73 = valignd_avx512vl(auVar71,auVar71,3);
          auVar70 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
          auVar74 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000))),
                                      auVar70,auVar74);
          auVar70 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar72 = vpermt2d_avx512vl(auVar74,auVar70,auVar72);
          auVar70 = vpermt2d_avx512vl(auVar72,auVar70,auVar12);
          auVar72 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar72 = vpermt2d_avx512vl(auVar70,auVar72,auVar69);
          auVar81 = ZEXT3264(auVar72);
          bVar24 = bVar18;
          do {
            auVar69 = auVar81._0_32_;
            auVar87._8_4_ = 1;
            auVar87._0_8_ = 0x100000001;
            auVar87._12_4_ = 1;
            auVar87._16_4_ = 1;
            auVar87._20_4_ = 1;
            auVar87._24_4_ = 1;
            auVar87._28_4_ = 1;
            auVar72 = vpermd_avx2(auVar87,auVar73);
            auVar73 = valignd_avx512vl(auVar73,auVar73,1);
            vpermt2q_avx512vl(auVar67,auVar73,auVar68);
            bVar24 = bVar24 - 1 & bVar24;
            uVar85 = vpcmpd_avx512vl(auVar72,auVar69,5);
            auVar72 = vpmaxsd_avx2(auVar72,auVar69);
            bVar23 = (byte)uVar85 << 1;
            auVar69 = valignd_avx512vl(auVar69,auVar69,7);
            bVar39 = (bool)((byte)uVar85 & 1);
            bVar7 = (bool)(bVar23 >> 2 & 1);
            bVar8 = (bool)(bVar23 >> 3 & 1);
            bVar9 = (bool)(bVar23 >> 4 & 1);
            bVar10 = (bool)(bVar23 >> 5 & 1);
            bVar11 = (bool)(bVar23 >> 6 & 1);
            auVar81 = ZEXT3264(CONCAT428((uint)(bVar23 >> 7) * auVar69._28_4_ |
                                         (uint)!(bool)(bVar23 >> 7) * auVar72._28_4_,
                                         CONCAT424((uint)bVar11 * auVar69._24_4_ |
                                                   (uint)!bVar11 * auVar72._24_4_,
                                                   CONCAT420((uint)bVar10 * auVar69._20_4_ |
                                                             (uint)!bVar10 * auVar72._20_4_,
                                                             CONCAT416((uint)bVar9 * auVar69._16_4_
                                                                       | (uint)!bVar9 *
                                                                         auVar72._16_4_,
                                                                       CONCAT412((uint)bVar8 *
                                                                                 auVar69._12_4_ |
                                                                                 (uint)!bVar8 *
                                                                                 auVar72._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar7 * auVar69._8_4_ |
                                                  (uint)!bVar7 * auVar72._8_4_,
                                                  CONCAT44((uint)bVar39 * auVar69._4_4_ |
                                                           (uint)!bVar39 * auVar72._4_4_,
                                                           auVar72._0_4_))))))));
          } while (bVar24 != 0);
          lVar21 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
          while( true ) {
            auVar69 = auVar81._0_32_;
            auVar72 = vpermt2q_avx512vl(auVar67,auVar69,auVar68);
            sVar38 = auVar72._0_8_;
            bVar39 = lVar21 == 0;
            lVar21 = lVar21 + -1;
            if (bVar39) break;
            (local_2640->ptr).ptr = sVar38;
            auVar72 = vpermd_avx2(auVar69,auVar66);
            local_2640->dist = auVar72._0_4_;
            auVar72 = valignd_avx512vl(auVar69,auVar69,1);
            auVar81 = ZEXT3264(auVar72);
            local_2640 = local_2640 + 1;
          }
          auVar43 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
          auVar111 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar112 = ZEXT1664(auVar43);
          auVar113 = ZEXT3264(local_2488);
          auVar114 = ZEXT3264(local_24a8);
          auVar115 = ZEXT3264(local_24c8);
        } while( true );
      }
      goto LAB_01c6590c;
    }
  }
  return;
LAB_01c65d4e:
  if (local_25e8 == local_25f0) goto LAB_01c66828;
  lVar26 = local_25e8 * 0x50;
  local_25e0 = context->scene;
  pGVar5 = (context->scene->geometries).items[*(uint *)(uVar40 + 0x30 + lVar26)].ptr;
  fVar92 = (pGVar5->time_range).lower;
  fVar92 = pGVar5->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar92) /
           ((pGVar5->time_range).upper - fVar92));
  auVar43 = vroundss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),9);
  auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar47 = vmaxss_avx512f(auVar111._0_16_,auVar43);
  lVar21 = (long)(int)auVar47._0_4_ * 0x38;
  uVar32 = (ulong)*(uint *)(uVar40 + 4 + lVar26);
  lVar31 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar21);
  lVar21 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar21);
  auVar43 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar40 + lVar26) * 4);
  uVar22 = CONCAT44(0,*(uint *)(uVar40 + 0x10 + lVar26));
  local_2608._0_8_ = uVar22;
  auVar44 = *(undefined1 (*) [16])(lVar31 + uVar22 * 4);
  uVar27 = (ulong)*(uint *)(uVar40 + 0x20 + lVar26);
  auVar45 = *(undefined1 (*) [16])(lVar31 + uVar27 * 4);
  auVar46 = *(undefined1 (*) [16])(lVar31 + uVar32 * 4);
  uVar28 = CONCAT44(0,*(uint *)(uVar40 + 0x14 + lVar26));
  local_2618._0_8_ = uVar28;
  auVar41 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
  uVar29 = (ulong)*(uint *)(uVar40 + 0x24 + lVar26);
  auVar42 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
  uVar30 = (ulong)*(uint *)(uVar40 + 8 + lVar26);
  auVar48 = *(undefined1 (*) [16])(lVar31 + uVar30 * 4);
  uVar36 = (ulong)*(uint *)(uVar40 + 0x18 + lVar26);
  auVar50 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
  uVar35 = (ulong)*(uint *)(uVar40 + 0x28 + lVar26);
  auVar60 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
  uVar34 = (ulong)*(uint *)(uVar40 + 0xc + lVar26);
  auVar58 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
  uVar33 = (ulong)*(uint *)(uVar40 + 0x1c + lVar26);
  auVar59 = *(undefined1 (*) [16])(lVar31 + uVar33 * 4);
  uVar37 = (ulong)*(uint *)(uVar40 + 0x2c + lVar26);
  auVar49 = *(undefined1 (*) [16])(lVar31 + uVar37 * 4);
  auVar51 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar40 + lVar26) * 4);
  auVar52 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
  auVar55 = *(undefined1 (*) [16])(lVar21 + uVar27 * 4);
  auVar53 = *(undefined1 (*) [16])(lVar21 + uVar32 * 4);
  auVar54 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
  auVar56 = *(undefined1 (*) [16])(lVar21 + uVar29 * 4);
  auVar57 = *(undefined1 (*) [16])(lVar21 + uVar30 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar21 + uVar36 * 4);
  auVar62 = *(undefined1 (*) [16])(lVar21 + uVar35 * 4);
  auVar63 = *(undefined1 (*) [16])(lVar21 + uVar34 * 4);
  auVar83 = *(undefined1 (*) [16])(lVar21 + uVar33 * 4);
  auVar86 = *(undefined1 (*) [16])(lVar21 + uVar37 * 4);
  puVar1 = (undefined8 *)(uVar40 + 0x30 + lVar26);
  local_2468 = *puVar1;
  uStack_2460 = puVar1[1];
  puVar1 = (undefined8 *)(uVar40 + 0x40 + lVar26);
  auVar88 = vunpcklps_avx(auVar43,auVar48);
  auVar43 = vunpckhps_avx(auVar43,auVar48);
  auVar48 = vunpcklps_avx(auVar46,auVar58);
  auVar46 = vunpckhps_avx(auVar46,auVar58);
  auVar58 = vunpcklps_avx(auVar43,auVar46);
  auVar89 = vunpcklps_avx(auVar88,auVar48);
  auVar43 = vunpckhps_avx(auVar88,auVar48);
  auVar48 = vunpcklps_avx(auVar44,auVar50);
  auVar44 = vunpckhps_avx(auVar44,auVar50);
  auVar50 = vunpcklps_avx(auVar41,auVar59);
  auVar46 = vunpckhps_avx(auVar41,auVar59);
  auVar41 = vunpcklps_avx(auVar44,auVar46);
  auVar59 = vunpcklps_avx(auVar48,auVar50);
  auVar44 = vunpckhps_avx(auVar48,auVar50);
  auVar48 = vunpcklps_avx(auVar45,auVar60);
  auVar45 = vunpckhps_avx(auVar45,auVar60);
  auVar50 = vunpcklps_avx(auVar42,auVar49);
  auVar46 = vunpckhps_avx(auVar42,auVar49);
  auVar42 = vunpcklps_avx(auVar45,auVar46);
  auVar60 = vunpcklps_avx(auVar48,auVar50);
  auVar45 = vunpckhps_avx(auVar48,auVar50);
  auVar46 = vunpcklps_avx512vl(auVar51,auVar57);
  auVar48 = vunpckhps_avx512vl(auVar51,auVar57);
  auVar49 = vunpcklps_avx512vl(auVar53,auVar63);
  auVar50 = vunpckhps_avx512vl(auVar53,auVar63);
  auVar48 = vunpcklps_avx(auVar48,auVar50);
  auVar50 = vunpcklps_avx(auVar46,auVar49);
  auVar46 = vunpckhps_avx(auVar46,auVar49);
  auVar49 = vunpcklps_avx512vl(auVar52,auVar61);
  auVar51 = vunpckhps_avx512vl(auVar52,auVar61);
  auVar52 = vunpcklps_avx512vl(auVar54,auVar83);
  auVar53 = vunpckhps_avx512vl(auVar54,auVar83);
  auVar51 = vunpcklps_avx512vl(auVar51,auVar53);
  auVar53 = vunpcklps_avx512vl(auVar49,auVar52);
  auVar52 = vunpckhps_avx512vl(auVar49,auVar52);
  auVar54 = vunpcklps_avx512vl(auVar55,auVar62);
  auVar49 = vunpckhps_avx512vl(auVar55,auVar62);
  auVar55 = vunpcklps_avx512vl(auVar56,auVar86);
  auVar56 = vunpckhps_avx512vl(auVar56,auVar86);
  auVar49 = vunpcklps_avx(auVar49,auVar56);
  auVar56 = vunpcklps_avx512vl(auVar54,auVar55);
  auVar55 = vunpckhps_avx512vl(auVar54,auVar55);
  auVar57 = ZEXT416((uint)(fVar92 - auVar47._0_4_));
  auVar54 = vbroadcastss_avx512vl(auVar57);
  auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar57);
  auVar61._0_4_ = auVar57._0_4_;
  auVar61._4_4_ = auVar61._0_4_;
  auVar61._8_4_ = auVar61._0_4_;
  auVar61._12_4_ = auVar61._0_4_;
  auVar50 = vmulps_avx512vl(auVar54,auVar50);
  auVar57 = vmulps_avx512vl(auVar54,auVar46);
  auVar48 = vmulps_avx512vl(auVar54,auVar48);
  auVar46 = vfmadd231ps_fma(auVar50,auVar61,auVar89);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar43);
  auVar48 = vfmadd231ps_fma(auVar48,auVar61,auVar58);
  auVar43 = vmulps_avx512vl(auVar54,auVar53);
  auVar58 = vmulps_avx512vl(auVar54,auVar52);
  auVar51 = vmulps_avx512vl(auVar54,auVar51);
  auVar50 = vfmadd231ps_fma(auVar43,auVar61,auVar59);
  auVar58 = vfmadd231ps_fma(auVar58,auVar61,auVar44);
  auVar59 = vfmadd231ps_avx512vl(auVar51,auVar61,auVar41);
  auVar43 = vmulps_avx512vl(auVar54,auVar56);
  auVar44 = vmulps_avx512vl(auVar54,auVar55);
  auVar49 = vmulps_avx512vl(auVar54,auVar49);
  auVar41 = vfmadd231ps_fma(auVar43,auVar61,auVar60);
  auVar60 = vfmadd231ps_fma(auVar44,auVar61,auVar45);
  auVar42 = vfmadd231ps_fma(auVar49,auVar61,auVar42);
  local_2578 = *puVar1;
  uStack_2570 = puVar1[1];
  uVar84 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar51._4_4_ = uVar84;
  auVar51._0_4_ = uVar84;
  auVar51._8_4_ = uVar84;
  auVar51._12_4_ = uVar84;
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar52._4_4_ = uVar84;
  auVar52._0_4_ = uVar84;
  auVar52._8_4_ = uVar84;
  auVar52._12_4_ = uVar84;
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar55._4_4_ = uVar84;
  auVar55._0_4_ = uVar84;
  auVar55._8_4_ = uVar84;
  auVar55._12_4_ = uVar84;
  uVar84 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar86._4_4_ = uVar84;
  auVar86._0_4_ = uVar84;
  auVar86._8_4_ = uVar84;
  auVar86._12_4_ = uVar84;
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  auVar88._4_4_ = uVar84;
  auVar88._0_4_ = uVar84;
  auVar88._8_4_ = uVar84;
  auVar88._12_4_ = uVar84;
  mapUV = (UVIdentity<4>)0x0;
  fVar92 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar91._4_4_ = fVar92;
  auVar91._0_4_ = fVar92;
  auVar91._8_4_ = fVar92;
  auVar91._12_4_ = fVar92;
  auVar43 = vsubps_avx(auVar46,auVar51);
  auVar49 = vsubps_avx512vl(auVar57,auVar52);
  auVar44 = vsubps_avx(auVar48,auVar55);
  auVar45 = vsubps_avx(auVar50,auVar51);
  auVar48 = vsubps_avx512vl(auVar58,auVar52);
  auVar50 = vsubps_avx512vl(auVar59,auVar55);
  auVar58 = vsubps_avx512vl(auVar41,auVar51);
  auVar46 = vsubps_avx(auVar60,auVar52);
  auVar60 = vsubps_avx512vl(auVar42,auVar55);
  auVar59 = vsubps_avx512vl(auVar58,auVar43);
  auVar41 = vsubps_avx(auVar46,auVar49);
  auVar51 = vsubps_avx512vl(auVar60,auVar44);
  auVar52 = vsubps_avx512vl(auVar43,auVar45);
  auVar55 = vsubps_avx512vl(auVar49,auVar48);
  auVar53 = vsubps_avx512vl(auVar44,auVar50);
  auVar54 = vsubps_avx512vl(auVar45,auVar58);
  auVar56 = vsubps_avx512vl(auVar48,auVar46);
  auVar57 = vsubps_avx512vl(auVar50,auVar60);
  auVar42 = vaddps_avx512vl(auVar58,auVar43);
  auVar89._0_4_ = auVar46._0_4_ + auVar49._0_4_;
  auVar89._4_4_ = auVar46._4_4_ + auVar49._4_4_;
  auVar89._8_4_ = auVar46._8_4_ + auVar49._8_4_;
  auVar89._12_4_ = auVar46._12_4_ + auVar49._12_4_;
  auVar61 = vaddps_avx512vl(auVar60,auVar44);
  auVar62 = vmulps_avx512vl(auVar89,auVar51);
  auVar62 = vfmsub231ps_avx512vl(auVar62,auVar41,auVar61);
  auVar61 = vmulps_avx512vl(auVar61,auVar59);
  auVar61 = vfmsub231ps_avx512vl(auVar61,auVar51,auVar42);
  auVar63._0_4_ = auVar41._0_4_ * auVar42._0_4_;
  auVar63._4_4_ = auVar41._4_4_ * auVar42._4_4_;
  auVar63._8_4_ = auVar41._8_4_ * auVar42._8_4_;
  auVar63._12_4_ = auVar41._12_4_ * auVar42._12_4_;
  auVar42 = vfmsub231ps_fma(auVar63,auVar59,auVar89);
  auVar83._0_4_ = fVar92 * auVar42._0_4_;
  auVar83._4_4_ = fVar92 * auVar42._4_4_;
  auVar83._8_4_ = fVar92 * auVar42._8_4_;
  auVar83._12_4_ = fVar92 * auVar42._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar83,auVar88,auVar61);
  local_2568 = vfmadd231ps_avx512vl(auVar42,auVar86,auVar62);
  auVar47._0_4_ = auVar45._0_4_ + auVar43._0_4_;
  auVar47._4_4_ = auVar45._4_4_ + auVar43._4_4_;
  auVar47._8_4_ = auVar45._8_4_ + auVar43._8_4_;
  auVar47._12_4_ = auVar45._12_4_ + auVar43._12_4_;
  auVar42 = vaddps_avx512vl(auVar49,auVar48);
  auVar61 = vaddps_avx512vl(auVar44,auVar50);
  auVar62 = vmulps_avx512vl(auVar42,auVar53);
  auVar62 = vfmsub231ps_avx512vl(auVar62,auVar55,auVar61);
  auVar61 = vmulps_avx512vl(auVar61,auVar52);
  auVar61 = vfmsub231ps_avx512vl(auVar61,auVar53,auVar47);
  auVar63 = vmulps_avx512vl(auVar47,auVar55);
  auVar42 = vfmsub231ps_avx512vl(auVar63,auVar52,auVar42);
  auVar90._0_4_ = fVar92 * auVar42._0_4_;
  auVar90._4_4_ = fVar92 * auVar42._4_4_;
  auVar90._8_4_ = fVar92 * auVar42._8_4_;
  auVar90._12_4_ = fVar92 * auVar42._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar61);
  local_2558 = vfmadd231ps_avx512vl(auVar42,auVar86,auVar62);
  auVar45 = vaddps_avx512vl(auVar45,auVar58);
  auVar46 = vaddps_avx512vl(auVar48,auVar46);
  auVar42 = vaddps_avx512vl(auVar50,auVar60);
  auVar48 = vmulps_avx512vl(auVar46,auVar57);
  auVar48 = vfmsub231ps_avx512vl(auVar48,auVar56,auVar42);
  auVar42 = vmulps_avx512vl(auVar42,auVar54);
  auVar42 = vfmsub231ps_avx512vl(auVar42,auVar57,auVar45);
  auVar58._0_4_ = auVar45._0_4_ * auVar56._0_4_;
  auVar58._4_4_ = auVar45._4_4_ * auVar56._4_4_;
  auVar58._8_4_ = auVar45._8_4_ * auVar56._8_4_;
  auVar58._12_4_ = auVar45._12_4_ * auVar56._12_4_;
  auVar45 = vfmsub231ps_fma(auVar58,auVar54,auVar46);
  auVar45 = vmulps_avx512vl(auVar91,auVar45);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar88,auVar42);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar86,auVar48);
  auVar60._0_4_ = local_2558._0_4_ + local_2568._0_4_;
  auVar60._4_4_ = local_2558._4_4_ + local_2568._4_4_;
  auVar60._8_4_ = local_2558._8_4_ + local_2568._8_4_;
  auVar60._12_4_ = local_2558._12_4_ + local_2568._12_4_;
  local_2548 = vaddps_avx512vl(auVar45,auVar60);
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  auVar46 = vandps_avx512vl(local_2548,auVar42);
  auVar50._8_4_ = 0x34000000;
  auVar50._0_8_ = 0x3400000034000000;
  auVar50._12_4_ = 0x34000000;
  auVar42 = vmulps_avx512vl(auVar46,auVar50);
  auVar48 = vminps_avx512vl(local_2568,local_2558);
  auVar48 = vminps_avx512vl(auVar48,auVar45);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar50 = vxorps_avx512vl(auVar42,auVar50);
  uVar85 = vcmpps_avx512vl(auVar48,auVar50,5);
  auVar48 = vmaxps_avx512vl(local_2568,local_2558);
  auVar45 = vmaxps_avx512vl(auVar48,auVar45);
  uVar13 = vcmpps_avx512vl(auVar45,auVar42,2);
  bVar18 = ((byte)uVar85 | (byte)uVar13) & 0xf;
  if (bVar18 != 0) {
    auVar45 = vmulps_avx512vl(auVar51,auVar55);
    auVar42 = vmulps_avx512vl(auVar59,auVar53);
    auVar48 = vmulps_avx512vl(auVar41,auVar52);
    auVar50 = vmulps_avx512vl(auVar53,auVar56);
    auVar60 = vmulps_avx512vl(auVar52,auVar57);
    auVar58 = vmulps_avx512vl(auVar55,auVar54);
    auVar41 = vfmsub213ps_avx512vl(auVar41,auVar53,auVar45);
    auVar51 = vfmsub213ps_avx512vl(auVar51,auVar52,auVar42);
    auVar59 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar48);
    auVar55 = vfmsub213ps_avx512vl(auVar57,auVar55,auVar50);
    auVar53 = vfmsub213ps_avx512vl(auVar54,auVar53,auVar60);
    auVar52 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar58);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar45 = vandps_avx512vl(auVar45,auVar54);
    auVar50 = vandps_avx512vl(auVar50,auVar54);
    uVar22 = vcmpps_avx512vl(auVar45,auVar50,1);
    auVar45 = vandps_avx512vl(auVar42,auVar54);
    auVar42 = vandps_avx512vl(auVar60,auVar54);
    uVar27 = vcmpps_avx512vl(auVar45,auVar42,1);
    auVar45 = vandps_avx512vl(auVar48,auVar54);
    auVar42 = vandps_avx512vl(auVar58,auVar54);
    uVar28 = vcmpps_avx512vl(auVar45,auVar42,1);
    bVar39 = (bool)((byte)uVar22 & 1);
    local_24f8._0_4_ = (uint)bVar39 * auVar41._0_4_ | (uint)!bVar39 * auVar55._0_4_;
    bVar39 = (bool)((byte)(uVar22 >> 1) & 1);
    local_24f8._4_4_ = (uint)bVar39 * auVar41._4_4_ | (uint)!bVar39 * auVar55._4_4_;
    bVar39 = (bool)((byte)(uVar22 >> 2) & 1);
    local_24f8._8_4_ = (uint)bVar39 * auVar41._8_4_ | (uint)!bVar39 * auVar55._8_4_;
    bVar39 = (bool)((byte)(uVar22 >> 3) & 1);
    local_24f8._12_4_ = (uint)bVar39 * auVar41._12_4_ | (uint)!bVar39 * auVar55._12_4_;
    bVar39 = (bool)((byte)uVar27 & 1);
    local_24e8._0_4_ = (uint)bVar39 * auVar51._0_4_ | (uint)!bVar39 * auVar53._0_4_;
    bVar39 = (bool)((byte)(uVar27 >> 1) & 1);
    local_24e8._4_4_ = (uint)bVar39 * auVar51._4_4_ | (uint)!bVar39 * auVar53._4_4_;
    bVar39 = (bool)((byte)(uVar27 >> 2) & 1);
    local_24e8._8_4_ = (uint)bVar39 * auVar51._8_4_ | (uint)!bVar39 * auVar53._8_4_;
    bVar39 = (bool)((byte)(uVar27 >> 3) & 1);
    local_24e8._12_4_ = (uint)bVar39 * auVar51._12_4_ | (uint)!bVar39 * auVar53._12_4_;
    bVar39 = (bool)((byte)uVar28 & 1);
    local_24d8[0] = (float)((uint)bVar39 * auVar59._0_4_ | (uint)!bVar39 * auVar52._0_4_);
    bVar39 = (bool)((byte)(uVar28 >> 1) & 1);
    local_24d8[1] = (float)((uint)bVar39 * auVar59._4_4_ | (uint)!bVar39 * auVar52._4_4_);
    bVar39 = (bool)((byte)(uVar28 >> 2) & 1);
    local_24d8[2] = (float)((uint)bVar39 * auVar59._8_4_ | (uint)!bVar39 * auVar52._8_4_);
    bVar39 = (bool)((byte)(uVar28 >> 3) & 1);
    local_24d8[3] = (float)((uint)bVar39 * auVar59._12_4_ | (uint)!bVar39 * auVar52._12_4_);
    auVar56._0_4_ = fVar92 * local_24d8[0];
    auVar56._4_4_ = fVar92 * local_24d8[1];
    auVar56._8_4_ = fVar92 * local_24d8[2];
    auVar56._12_4_ = fVar92 * local_24d8[3];
    auVar45 = vfmadd213ps_fma(auVar88,local_24e8,auVar56);
    auVar45 = vfmadd213ps_fma(auVar86,local_24f8,auVar45);
    auVar53._0_4_ = auVar45._0_4_ + auVar45._0_4_;
    auVar53._4_4_ = auVar45._4_4_ + auVar45._4_4_;
    auVar53._8_4_ = auVar45._8_4_ + auVar45._8_4_;
    auVar53._12_4_ = auVar45._12_4_ + auVar45._12_4_;
    auVar54._0_4_ = auVar44._0_4_ * local_24d8[0];
    auVar54._4_4_ = auVar44._4_4_ * local_24d8[1];
    auVar54._8_4_ = auVar44._8_4_ * local_24d8[2];
    auVar54._12_4_ = auVar44._12_4_ * local_24d8[3];
    auVar44 = vfmadd213ps_fma(auVar49,local_24e8,auVar54);
    auVar44 = vfmadd213ps_fma(auVar43,local_24f8,auVar44);
    auVar43 = vrcp14ps_avx512vl(auVar53);
    auVar42 = auVar112._0_16_;
    auVar45 = vfnmadd213ps_avx512vl(auVar43,auVar53,auVar42);
    auVar43 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
    local_2508._0_4_ = (auVar44._0_4_ + auVar44._0_4_) * auVar43._0_4_;
    local_2508._4_4_ = (auVar44._4_4_ + auVar44._4_4_) * auVar43._4_4_;
    local_2508._8_4_ = (auVar44._8_4_ + auVar44._8_4_) * auVar43._8_4_;
    local_2508._12_4_ = (auVar44._12_4_ + auVar44._12_4_) * auVar43._12_4_;
    auVar80 = ZEXT1664(local_2508);
    uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar41._4_4_ = uVar84;
    auVar41._0_4_ = uVar84;
    auVar41._8_4_ = uVar84;
    auVar41._12_4_ = uVar84;
    uVar85 = vcmpps_avx512vl(local_2508,auVar41,0xd);
    uVar22 = CONCAT44(auVar53._4_4_,auVar53._0_4_);
    auVar49._0_8_ = uVar22 ^ 0x8000000080000000;
    auVar49._8_4_ = -auVar53._8_4_;
    auVar49._12_4_ = -auVar53._12_4_;
    fVar92 = (ray->super_RayK<1>).tfar;
    auVar59._4_4_ = fVar92;
    auVar59._0_4_ = fVar92;
    auVar59._8_4_ = fVar92;
    auVar59._12_4_ = fVar92;
    uVar13 = vcmpps_avx512vl(local_2508,auVar59,2);
    uVar14 = vcmpps_avx512vl(auVar53,auVar49,4);
    bVar18 = (byte)uVar85 & (byte)uVar13 & (byte)uVar14 & bVar18;
    if (bVar18 != 0) {
      auVar57._0_4_ = (ray->super_RayK<1>).tfar;
      auVar57._4_4_ = (ray->super_RayK<1>).mask;
      auVar57._8_4_ = (ray->super_RayK<1>).id;
      auVar57._12_4_ = (ray->super_RayK<1>).flags;
      auVar81 = ZEXT1664(auVar57);
      uVar19 = vextractps_avx(auVar57,1);
      local_2538 = &mapUV;
      local_2530 = bVar18;
      auVar62._8_4_ = 0x219392ef;
      auVar62._0_8_ = 0x219392ef219392ef;
      auVar62._12_4_ = 0x219392ef;
      uVar22 = vcmpps_avx512vl(auVar46,auVar62,5);
      auVar43 = vrcp14ps_avx512vl(local_2548);
      auVar44 = vfnmadd213ps_avx512vl(local_2548,auVar43,auVar42);
      auVar43 = vfmadd132ps_avx512vl(auVar44,auVar43,auVar43);
      fVar92 = (float)((uint)((byte)uVar22 & 1) * auVar43._0_4_);
      fVar93 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar43._4_4_);
      fVar94 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar43._8_4_);
      fVar95 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar43._12_4_);
      auVar76._0_4_ = fVar92 * local_2568._0_4_;
      auVar76._4_4_ = fVar93 * local_2568._4_4_;
      auVar76._8_4_ = fVar94 * local_2568._8_4_;
      auVar76._12_4_ = fVar95 * local_2568._12_4_;
      local_2528 = vminps_avx512vl(auVar76,auVar42);
      auVar77._0_4_ = fVar92 * local_2558._0_4_;
      auVar77._4_4_ = fVar93 * local_2558._4_4_;
      auVar77._8_4_ = fVar94 * local_2558._8_4_;
      auVar77._12_4_ = fVar95 * local_2558._12_4_;
      local_2518 = vminps_avx512vl(auVar77,auVar42);
      auVar78._8_4_ = 0x7f800000;
      auVar78._0_8_ = 0x7f8000007f800000;
      auVar78._12_4_ = 0x7f800000;
      auVar43 = vblendmps_avx512vl(auVar78,local_2508);
      auVar64._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
      bVar39 = (bool)(bVar18 >> 1 & 1);
      auVar64._4_4_ = (uint)bVar39 * auVar43._4_4_ | (uint)!bVar39 * 0x7f800000;
      bVar39 = (bool)(bVar18 >> 2 & 1);
      auVar64._8_4_ = (uint)bVar39 * auVar43._8_4_ | (uint)!bVar39 * 0x7f800000;
      auVar64._12_4_ =
           (uint)(bVar18 >> 3) * auVar43._12_4_ | (uint)!(bool)(bVar18 >> 3) * 0x7f800000;
      auVar43 = vshufps_avx(auVar64,auVar64,0xb1);
      auVar43 = vminps_avx(auVar43,auVar64);
      auVar44 = vshufpd_avx(auVar43,auVar43,1);
      auVar43 = vminps_avx(auVar44,auVar43);
      uVar85 = vcmpps_avx512vl(auVar64,auVar43,0);
      bVar24 = (byte)uVar85 & bVar18;
      do {
        auVar43 = auVar111._0_16_;
        bVar23 = bVar18;
        if (bVar24 != 0) {
          bVar23 = bVar24;
        }
        uVar15 = 0;
        for (uVar25 = (uint)bVar23; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
          uVar15 = uVar15 + 1;
        }
        h.geomID = *(uint *)((long)&local_2468 + (ulong)uVar15 * 4);
        pGVar5 = (local_25e0->geometries).items[h.geomID].ptr;
        if ((pGVar5->mask & uVar19) == 0) {
          bVar18 = ~(byte)(1 << (uVar15 & 0x1f)) & bVar18;
        }
        else {
          pRVar6 = context->args;
          auVar44 = auVar81._0_16_;
          if (pRVar6->filter == (RTCFilterFunctionN)0x0) {
            args.context = context->user;
            if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
              uVar22 = (ulong)(uVar15 << 2);
              fVar92 = *(float *)(local_2528 + uVar22);
              fVar93 = *(float *)(local_2518 + uVar22);
              (ray->super_RayK<1>).tfar = *(float *)(local_2508 + uVar22);
              (ray->Ng).field_0.field_0.x = *(float *)(local_24f8 + uVar22);
              (ray->Ng).field_0.field_0.y = *(float *)(local_24e8 + uVar22);
              (ray->Ng).field_0.field_0.z = *(float *)((long)local_24d8 + uVar22);
              ray->u = fVar92;
              ray->v = fVar93;
              ray->primID = *(uint *)((long)&local_2578 + uVar22);
              ray->geomID = h.geomID;
              ray->instID[0] = (args.context)->instID[0];
              ray->instPrimID[0] = (args.context)->instPrimID[0];
              break;
            }
            local_2618 = auVar44;
          }
          else {
            local_2618 = auVar44;
            args.context = context->user;
          }
          uVar22 = (ulong)(uVar15 * 4);
          h.Ng.field_0.field_0.x = *(float *)(local_24f8 + uVar22);
          h.Ng.field_0.field_0.y = *(float *)(local_24e8 + uVar22);
          h.Ng.field_0.field_0.z = *(float *)((long)local_24d8 + uVar22);
          h.u = *(float *)(local_2528 + uVar22);
          h.v = *(float *)(local_2518 + uVar22);
          h.primID = *(uint *)((long)&local_2578 + uVar22);
          h.instID[0] = (args.context)->instID[0];
          h.instPrimID[0] = (args.context)->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_2508 + uVar22);
          local_261c = -1;
          args.valid = &local_261c;
          args.geometryUserPtr = pGVar5->userPtr;
          args.ray = (RTCRayN *)ray;
          args.hit = (RTCHitN *)&h;
          args.N = 1;
          local_2608 = auVar80._0_16_;
          local_2618 = auVar44;
          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c6663c:
            auVar43 = auVar111._0_16_;
            if ((pRVar6->filter != (RTCFilterFunctionN)0x0) &&
               (((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*pRVar6->filter)(&args);
              auVar80 = ZEXT1664(local_2608);
              auVar115 = ZEXT3264(local_24c8);
              auVar114 = ZEXT3264(local_24a8);
              auVar113 = ZEXT3264(local_2488);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar112 = ZEXT1664(auVar44);
              auVar43 = vxorps_avx512vl(auVar43,auVar43);
              auVar111 = ZEXT1664(auVar43);
              if (*args.valid == 0) goto LAB_01c66716;
            }
            *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
            *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
            *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
            *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
            *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
            *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
            *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
            *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
            *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
          }
          else {
            (*pGVar5->intersectionFilterN)(&args);
            auVar80 = ZEXT1664(local_2608);
            auVar115 = ZEXT3264(local_24c8);
            auVar114 = ZEXT3264(local_24a8);
            auVar113 = ZEXT3264(local_2488);
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar112 = ZEXT1664(auVar44);
            auVar43 = vxorps_avx512vl(auVar43,auVar43);
            auVar111 = ZEXT1664(auVar43);
            if (*args.valid != 0) goto LAB_01c6663c;
LAB_01c66716:
            (ray->super_RayK<1>).tfar = (float)local_2618._0_4_;
          }
          auVar4._0_4_ = (ray->super_RayK<1>).tfar;
          auVar4._4_4_ = (ray->super_RayK<1>).mask;
          auVar4._8_4_ = (ray->super_RayK<1>).id;
          auVar4._12_4_ = (ray->super_RayK<1>).flags;
          auVar81 = ZEXT1664(auVar4);
          fVar92 = (ray->super_RayK<1>).tfar;
          auVar16._4_4_ = fVar92;
          auVar16._0_4_ = fVar92;
          auVar16._8_4_ = fVar92;
          auVar16._12_4_ = fVar92;
          uVar85 = vcmpps_avx512vl(auVar80._0_16_,auVar16,2);
          bVar18 = ~(byte)(1 << (uVar15 & 0x1f)) & bVar18 & (byte)uVar85;
          uVar19 = vextractps_avx(auVar4,1);
        }
        if (bVar18 == 0) break;
        auVar79._8_4_ = 0x7f800000;
        auVar79._0_8_ = 0x7f8000007f800000;
        auVar79._12_4_ = 0x7f800000;
        auVar43 = vblendmps_avx512vl(auVar79,auVar80._0_16_);
        auVar65._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
        bVar39 = (bool)(bVar18 >> 1 & 1);
        auVar65._4_4_ = (uint)bVar39 * auVar43._4_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(bVar18 >> 2 & 1);
        auVar65._8_4_ = (uint)bVar39 * auVar43._8_4_ | (uint)!bVar39 * 0x7f800000;
        auVar65._12_4_ =
             (uint)(bVar18 >> 3) * auVar43._12_4_ | (uint)!(bool)(bVar18 >> 3) * 0x7f800000;
        auVar43 = vshufps_avx(auVar65,auVar65,0xb1);
        auVar43 = vminps_avx(auVar43,auVar65);
        auVar44 = vshufpd_avx(auVar43,auVar43,1);
        auVar43 = vminps_avx(auVar44,auVar43);
        uVar85 = vcmpps_avx512vl(auVar65,auVar43,0);
        bVar24 = (byte)uVar85 & bVar18;
      } while( true );
    }
  }
  local_25e8 = local_25e8 + 1;
  auVar98 = ZEXT3264(local_23b8);
  auVar99 = ZEXT3264(local_23d8);
  auVar106 = ZEXT3264(local_2418);
  auVar107 = ZEXT3264(local_2438);
  auVar108 = ZEXT3264(local_2458);
  lVar31 = local_25f8;
  fVar82 = local_2398;
  fVar92 = fStack_2394;
  fVar93 = fStack_2390;
  fVar94 = fStack_238c;
  fVar95 = fStack_2388;
  fVar96 = fStack_2384;
  fVar97 = fStack_2380;
  fVar75 = local_23f8;
  fVar100 = fStack_23f4;
  fVar101 = fStack_23f0;
  fVar102 = fStack_23ec;
  fVar103 = fStack_23e8;
  fVar104 = fStack_23e4;
  fVar105 = fStack_23e0;
  goto LAB_01c65d4e;
LAB_01c66828:
  fVar2 = (ray->super_RayK<1>).tfar;
  auVar80 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(fVar2
                                                  ,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  auVar81 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
  auVar66 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar109 = ZEXT3264(auVar66);
  auVar66 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar110 = ZEXT3264(auVar66);
  goto LAB_01c6590c;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }